

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KBO.cpp
# Opt level: O2

KBO * Kernel::KBO::testKBO(KBO *__return_storage_ptr__,bool rand,bool qkbo)

{
  undefined7 in_register_00000031;
  bool rand_local;
  anon_class_8_1_8990f923 prec;
  DArray<int> local_a8;
  DArray<int> local_90;
  DArray<int> local_78;
  DArray<int> local_60;
  KboWeightMap<Kernel::FuncSigTraits> local_48;
  
  prec.rand = &rand_local;
  rand_local = rand;
  if ((int)CONCAT71(in_register_00000031,rand) == 0) {
    KboWeightMap<Kernel::FuncSigTraits>::dflt(&local_48,qkbo);
  }
  else {
    KboWeightMap<Kernel::FuncSigTraits>::randomized(&local_48,qkbo);
  }
  testKBO::anon_class_8_1_8990f923::operator()
            (&local_60,&prec,
             (int)((ulong)(*(long *)(DAT_00a14190 + 0x68) - *(long *)(DAT_00a14190 + 0x60)) >> 3));
  testKBO::anon_class_8_1_8990f923::operator()
            (&local_78,&prec,
             (int)((ulong)(*(long *)(DAT_00a14190 + 0xa8) - *(long *)(DAT_00a14190 + 0xa0)) >> 3));
  testKBO::anon_class_8_1_8990f923::operator()
            (&local_90,&prec,
             (int)((ulong)(*(long *)(DAT_00a14190 + 0x88) - *(long *)(DAT_00a14190 + 0x80)) >> 3));
  PrecedenceOrdering::testLevels();
  KBO(__return_storage_ptr__,&local_48,&local_60,&local_78,&local_90,&local_a8,false,qkbo);
  Lib::DArray<int>::~DArray(&local_a8);
  Lib::DArray<int>::~DArray(&local_90);
  Lib::DArray<int>::~DArray(&local_78);
  Lib::DArray<int>::~DArray(&local_60);
  Lib::DArray<unsigned_int>::~DArray(&local_48._weights);
  return __return_storage_ptr__;
}

Assistant:

KBO KBO::testKBO(bool rand, bool qkbo)
{
  auto predLevels = []() -> DArray<int>
    { return PrecedenceOrdering::testLevels(); };

  auto prec = [&](int size) {
    auto out = DArray<int>::fromIterator(range(0,size));
    if (rand) {
      Shuffling::shuffleArray(out, size);
    }
    return out;
  };
  return KBO(
      rand ? KboWeightMap<FuncSigTraits>::randomized(qkbo) : KboWeightMap<FuncSigTraits>::dflt(qkbo),
#if __KBO__CUSTOM_PREDICATE_WEIGHTS__
      rand ? KboWeightMap<PredSigTraits>::randomized(qkbo) : KboWeightMap<PredSigTraits>::dflt(qkbo),
#endif
      prec(env.signature->functions()),
      prec(env.signature->typeCons()),
      prec(env.signature->predicates()),
      predLevels(),
      /*reverseLCM=*/false,
      qkbo);
}